

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateResult<mp::LinTerms,mp::AlgConRhs<2>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *con,Context ctx)

{
  bool bVar1;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *in_RSI;
  Context *in_RDI;
  LinTerms *lint;
  double dVar2;
  double UB;
  double LB;
  Context ctx_new;
  double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  Context ctx_00;
  Context local_1c;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *local_18;
  Context local_4;
  
  local_18 = in_RSI;
  lint = (LinTerms *)AlgConRhs<2>::lb((AlgConRhs<2> *)0x25e4dd);
  dVar2 = BasicFlatConverter::PracticallyMinusInf();
  if (dVar2 < (double)lint) {
    in_stack_ffffffffffffffb0 = AlgConRhs<2>::ub(&local_18->super_AlgConRhs<2>);
    dVar2 = BasicFlatConverter::PracticallyInf();
    if (in_stack_ffffffffffffffb0 < dVar2) {
      Context::Context(&local_1c,CTX_MIX);
    }
    else {
      local_1c = Context::operator+(in_RDI);
    }
  }
  else {
    local_1c = Context::operator-(in_RDI);
  }
  BasicFlatConverter::MinusInfty();
  dVar2 = BasicFlatConverter::Infty();
  ctx_00.value_ = (CtxVal)((ulong)dVar2 >> 0x20);
  bVar1 = Context::IsRoot(&local_4);
  if (bVar1) {
    AlgConRhs<2>::lb((AlgConRhs<2> *)0x25e587);
    dVar2 = AlgConRhs<2>::ub(&local_18->super_AlgConRhs<2>);
    ctx_00.value_ = (CtxVal)((ulong)dVar2 >> 0x20);
  }
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>::GetBody(local_18);
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::PropagateResult2Args
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT44(local_1c.value_,in_stack_ffffffffffffffc8),lint,(double)in_RDI,
             in_stack_ffffffffffffffb0,ctx_00);
  return;
}

Assistant:

void PropagateResult(const AlgebraicConstraint< Body, RngOrRhs >& con,
                       Context ctx) {
    /// Distinguish bounds' finiteness for context
    auto ctx_new = con.lb()<=MPCD( PracticallyMinusInf() )
                   ? -ctx : (con.ub()>=MPCD( PracticallyInf() )
                          ? +ctx : Context::CTX_MIX);
    auto LB = MPCD( MinusInfty() );
    auto UB = MPCD( Infty() );
    if (ctx.IsRoot()) {             // not for conditional comparisons
      LB = con.lb();
      UB = con.ub();
    }
    PropagateResult2Args(con.GetBody(), LB, UB, ctx_new);
  }